

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

string * __thiscall
antlr::NoViableAltException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltException *this)

{
  TokenRef *pTVar1;
  Token *pTVar2;
  ASTRef *pAVar3;
  int iVar4;
  char *__s;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pTVar1 = (this->token).ref;
  if ((pTVar1 == (TokenRef *)0x0) || (pTVar2 = pTVar1->ptr, pTVar2 == (Token *)0x0)) {
    pAVar3 = (this->node).ref;
    if ((pAVar3 != (ASTRef *)0x0) && (pAVar3->ptr != (AST *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"unexpected AST node: ",&local_51);
      (*((this->node).ref)->ptr->_vptr_AST[0x18])(&local_30);
      std::operator+(__return_storage_ptr__,&local_50,&local_30);
LAB_00178c23:
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    __s = "unexpected end of subtree";
  }
  else {
    iVar4 = (*pTVar2->_vptr_Token[6])();
    if (iVar4 == 1) {
      __s = "unexpected end of file";
    }
    else {
      iVar4 = (*((this->token).ref)->ptr->_vptr_Token[6])();
      if (iVar4 != 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"unexpected token: ",&local_51);
        (*((this->token).ref)->ptr->_vptr_Token[4])(&local_30);
        std::operator+(__return_storage_ptr__,&local_50,&local_30);
        goto LAB_00178c23;
      }
      __s = "unexpected end of tree";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string NoViableAltException::getMessage() const
{
	if (token)
	{
		if( token->getType() == Token::EOF_TYPE )
			return string("unexpected end of file");
		else if( token->getType() == Token::NULL_TREE_LOOKAHEAD )
			return string("unexpected end of tree");
		else
			return string("unexpected token: ")+token->getText();
	}

	// must a tree parser error if token==null
	if (!node)
		return "unexpected end of subtree";

	return string("unexpected AST node: ")+node->toString();
}